

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

void __thiscall
Js::JavascriptLibrary::SetCrossSiteForLockedNonBuiltInFunctionType
          (JavascriptLibrary *this,JavascriptFunction *function)

{
  bool bVar1;
  int iVar2;
  BOOL BVar3;
  DynamicType *in_RAX;
  FunctionProxy *this_00;
  DynamicTypeHandler *pDVar4;
  ScriptFunctionType *pSVar5;
  PathTypeHandlerBase *pPVar6;
  ScriptFunction *pSVar7;
  undefined4 extraout_var;
  DynamicType *local_38;
  DynamicType *type;
  
  local_38 = in_RAX;
  this_00 = JavascriptFunction::GetFunctionProxy(function);
  pDVar4 = DynamicObject::GetTypeHandler(&function->super_DynamicObject);
  iVar2 = (*pDVar4->_vptr_DynamicTypeHandler[0x4d])(pDVar4);
  if (iVar2 == 0) {
    if (this_00 != (FunctionProxy *)0x0) {
      pSVar5 = FunctionProxy::GetCrossSiteUndeferredFunctionType(this_00);
      if (pSVar5 != (ScriptFunctionType *)0x0) {
        pSVar5 = FunctionProxy::GetCrossSiteUndeferredFunctionType(this_00);
        goto LAB_00aa5ee2;
      }
    }
    iVar2 = (*pDVar4->_vptr_DynamicTypeHandler[0x4e])(pDVar4);
    if (iVar2 == 0) {
      DynamicObject::ChangeType(&function->super_DynamicObject);
    }
    else {
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ShareCrossSiteFuncTypesPhase);
      if (bVar1) {
        pPVar6 = PathTypeHandlerBase::FromTypeHandler(pDVar4);
        PathTypeHandlerBase::ConvertToNonShareableTypeHandler(pPVar6,&function->super_DynamicObject)
        ;
      }
      else {
        iVar2 = (*(function->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x67])(function);
        local_38 = (DynamicType *)CONCAT44(extraout_var,iVar2);
        pPVar6 = PathTypeHandlerBase::FromTypeHandler(pDVar4);
        PathTypeHandlerBase::BuildPathTypeFromNewRoot
                  (pPVar6,&function->super_DynamicObject,&local_38);
        DynamicObject::ReplaceType(&function->super_DynamicObject,local_38);
      }
    }
    JavascriptFunction::SetEntryPoint
              (function,((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                        CurrentCrossSiteThunk);
    if (this_00 != (FunctionProxy *)0x0) {
      BVar3 = FunctionProxy::HasParseableInfo(this_00);
      if (BVar3 != 0) {
        pDVar4 = DynamicObject::GetTypeHandler(&function->super_DynamicObject);
        if ((pDVar4->flags & 8) != 0) {
          bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ShareCrossSiteFuncTypesPhase);
          if (!bVar1) {
            DynamicObject::ShareType(&function->super_DynamicObject);
            pSVar7 = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(function);
            pSVar5 = ScriptFunction::GetScriptFunctionType(pSVar7);
            FunctionProxy::SetCrossSiteUndeferredFunctionType(this_00,pSVar5);
          }
        }
      }
    }
  }
  else {
    if (this_00 == (FunctionProxy *)0x0) {
      DynamicObject::ChangeType(&function->super_DynamicObject);
      JavascriptFunction::SetEntryPoint
                (function,((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                          CurrentCrossSiteThunk);
      return;
    }
    pSVar5 = FunctionProxy::GetCrossSiteDeferredFunctionType(this_00);
    if (pSVar5 != (ScriptFunctionType *)0x0) {
      pSVar5 = FunctionProxy::GetCrossSiteDeferredFunctionType(this_00);
LAB_00aa5ee2:
      DynamicObject::ReplaceType(&function->super_DynamicObject,&pSVar5->super_DynamicType);
      return;
    }
    DynamicObject::ChangeType(&function->super_DynamicObject);
    JavascriptFunction::SetEntryPoint
              (function,((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                        CurrentCrossSiteThunk);
    BVar3 = FunctionProxy::HasParseableInfo(this_00);
    if (BVar3 != 0) {
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,ShareCrossSiteFuncTypesPhase);
      if (!bVar1) {
        DynamicObject::ShareType(&function->super_DynamicObject);
        pSVar7 = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(function);
        pSVar5 = ScriptFunction::GetScriptFunctionType(pSVar7);
        FunctionProxy::SetCrossSiteDeferredFunctionType(this_00,pSVar5);
        return;
      }
    }
  }
  return;
}

Assistant:

void JavascriptLibrary::SetCrossSiteForLockedNonBuiltInFunctionType(JavascriptFunction * function)
    {
        FunctionProxy * functionProxy = function->GetFunctionProxy();
        DynamicTypeHandler *typeHandler = function->GetTypeHandler();
        if (typeHandler->IsDeferredTypeHandler())
        {
            if (functionProxy && functionProxy->GetCrossSiteDeferredFunctionType())
            {
                function->ReplaceType(functionProxy->GetCrossSiteDeferredFunctionType());
            }
            else
            {
                function->ChangeType();
                function->SetEntryPoint(scriptContext->CurrentCrossSiteThunk);
                if (functionProxy && functionProxy->HasParseableInfo() && !PHASE_OFF1(ShareCrossSiteFuncTypesPhase))
                {
                    function->ShareType();
                    functionProxy->SetCrossSiteDeferredFunctionType(UnsafeVarTo<ScriptFunction>(function)->GetScriptFunctionType());
                }
            }
        }
        else 
        {
            if (functionProxy && functionProxy->GetCrossSiteUndeferredFunctionType())
            {
                function->ReplaceType(functionProxy->GetCrossSiteUndeferredFunctionType());
            }
            else
            {
                if (typeHandler->IsPathTypeHandler())
                {
                    if (!PHASE_OFF1(ShareCrossSiteFuncTypesPhase))
                    {
                        DynamicType *type = function->DuplicateType();
                        PathTypeHandlerBase::FromTypeHandler(typeHandler)->BuildPathTypeFromNewRoot(function, &type);
                        function->ReplaceType(type);
                    }
                    else
                    {
                        PathTypeHandlerBase::FromTypeHandler(typeHandler)->ConvertToNonShareableTypeHandler(function);
                    }
                }
                else
                {
                    function->ChangeType();
                }
                function->SetEntryPoint(scriptContext->CurrentCrossSiteThunk);
                if (functionProxy && functionProxy->HasParseableInfo() && function->GetTypeHandler()->GetMayBecomeShared() && !PHASE_OFF1(ShareCrossSiteFuncTypesPhase))
                {
                    function->ShareType();
                    functionProxy->SetCrossSiteUndeferredFunctionType(UnsafeVarTo<ScriptFunction>(function)->GetScriptFunctionType());
                }
            }
        }
    }